

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O0

void Gia_ManEraFree(Gia_ManEra_t *p)

{
  Gia_ManEra_t *p_local;
  
  Mem_FixedStop(p->pMemory,0);
  Vec_IntFree(p->vStgDump);
  Vec_PtrFree(p->vStates);
  if (p->vBugTrace != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vBugTrace);
  }
  if (p->pDataSim != (uint *)0x0) {
    free(p->pDataSim);
    p->pDataSim = (uint *)0x0;
  }
  if (p->pBins != (uint *)0x0) {
    free(p->pBins);
    p->pBins = (uint *)0x0;
  }
  if (p != (Gia_ManEra_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Gia_ManEraFree( Gia_ManEra_t * p )
{
    Mem_FixedStop( p->pMemory, 0 );
    Vec_IntFree( p->vStgDump );
    Vec_PtrFree( p->vStates );
    if ( p->vBugTrace ) Vec_IntFree( p->vBugTrace );
    ABC_FREE( p->pDataSim );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}